

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

_Bool hex_decode(char *str,size_t slen,void *buf,size_t bufsize)

{
  _Bool _Var1;
  bool local_41;
  byte *local_40;
  uchar *p;
  uchar v2;
  size_t sStack_30;
  uchar v1;
  size_t bufsize_local;
  void *buf_local;
  size_t slen_local;
  char *str_local;
  
  local_40 = (byte *)buf;
  sStack_30 = bufsize;
  bufsize_local = (size_t)buf;
  buf_local = (void *)slen;
  slen_local = (size_t)str;
  while( true ) {
    if (buf_local < (void *)0x2) {
      local_41 = buf_local == (void *)0x0 && sStack_30 == 0;
      return local_41;
    }
    _Var1 = char_to_hex((uchar *)((long)&p + 7),*(char *)slen_local);
    if ((!_Var1) || (_Var1 = char_to_hex((uchar *)((long)&p + 6),*(char *)(slen_local + 1)), !_Var1)
       ) break;
    if (sStack_30 == 0) {
      return false;
    }
    *local_40 = p._7_1_ << 4 | p._6_1_;
    slen_local = slen_local + 2;
    buf_local = (void *)((long)buf_local + -2);
    sStack_30 = sStack_30 - 1;
    local_40 = local_40 + 1;
  }
  return false;
}

Assistant:

bool hex_decode(const char *str, size_t slen, void *buf, size_t bufsize)
{
	unsigned char v1, v2;
	unsigned char *p = buf;

	while (slen > 1) {
		if (!char_to_hex(&v1, str[0]) || !char_to_hex(&v2, str[1]))
			return false;
		if (!bufsize)
			return false;
		*(p++) = (v1 << 4) | v2;
		str += 2;
		slen -= 2;
		bufsize--;
	}
	return slen == 0 && bufsize == 0;
}